

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O0

char __thiscall TextProviderString::advance(TextProviderString *this)

{
  bool bVar1;
  uint uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var3;
  reference pcVar4;
  element_type *peVar5;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [32];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  byte local_11;
  TextProviderString *pTStack_10;
  bool avoid_iterator_increment;
  TextProviderString *this_local;
  
  local_11 = 0;
  pTStack_10 = this;
  bVar1 = std::
          optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::has_value(&this->m_iterator);
  if (!bVar1) {
    local_20._M_current = (char *)std::__cxx11::string::begin();
    std::optional<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::operator=
              ((optional<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>> *)
               &this->m_iterator,&local_20);
    local_11 = 1;
  }
  uVar2 = (*(this->super_TextProvider)._vptr_TextProvider[2])();
  if ((uVar2 & 1) == 0) {
    (this->super_TextProvider).m_current_char = '\0';
  }
  else {
    (this->super_TextProvider).m_current_char_idx =
         (this->super_TextProvider).m_current_char_idx + 1;
    if ((local_11 & 1) == 0) {
      p_Var3 = std::
               optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::value(&this->m_iterator);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(p_Var3);
    }
    p_Var3 = std::
             optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value(&this->m_iterator);
    local_28._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(p_Var3,&local_28);
    if (bVar1) {
      p_Var3 = std::
               optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::value(&this->m_iterator);
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(p_Var3);
      (this->super_TextProvider).m_current_char = *pcVar4;
    }
    else {
      (this->super_TextProvider).m_current_char = '\0';
    }
    if (0x7f < (byte)(this->super_TextProvider).m_current_char) {
      peVar5 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&(this->super_TextProvider).m_logger);
      std::__cxx11::string::string
                (local_48,(string *)&TextProvider::m_parser_text_provider_log_cat_abi_cxx11_);
      std::__cxx11::to_string(&local_a8,(this->super_TextProvider).m_current_char_idx);
      std::operator+(&local_88,"detected non ascii character ( n : ",&local_a8);
      std::operator+(&local_68,&local_88,
                     ". this interpreter does not yet support unicode files, sorry :/");
      (*peVar5->_vptr_PSLogger[2])(peVar5,4,local_48,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string(local_48);
      (this->super_TextProvider).m_has_error = true;
    }
  }
  return (this->super_TextProvider).m_current_char;
}

Assistant:

char TextProviderString::advance()
{
	//todo this is probably the wrong way to deal with the fact that contrary to the "get" method on the file, the iterator already points to a valid char if the text is not empty but I'm too tired so this'll work for now.
	//todo it's ugly though and it makes "peek" unusable before "advance". Also, using "reverse" until the beggining of the string would mess it all
	bool avoid_iterator_increment = false;

	if(!m_iterator.has_value())
	{
		m_iterator = m_text.begin();
		avoid_iterator_increment = true;
	}

	if(is_valid())
	{
		++m_current_char_idx;

		if(!avoid_iterator_increment)
		{
			++m_iterator.value();
		}

		if(m_iterator.value() != m_text.end())
		{
			m_current_char = *m_iterator.value();
		}
		else
		{
			m_current_char = '\0';
		}

		if( static_cast<unsigned char>(m_current_char) > 127)
		{
			m_logger->log(PSLogger::LogType::Error, m_parser_text_provider_log_cat,
			"detected non ascii character ( n : "+to_string(m_current_char_idx)+". this interpreter does not yet support unicode files, sorry :/");
			//todo add a line counter in this class to make these function return the correct line
			m_has_error = true;
		}
	}
	else
	{
		m_current_char = '\0';
	}
	return m_current_char;
}